

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O2

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<10,_6,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  float fVar1;
  int r;
  long lVar2;
  int in_ECX;
  undefined4 in_register_00000014;
  Matrix<float,_3,_2> retVal;
  Type in0;
  Matrix<float,_3,_2> local_64;
  Mat2x3 local_4c;
  MatrixCaseUtils local_34 [12];
  VecAccess<float,_4,_3> local_28;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    sr::(anonymous_namespace)::MatrixCaseUtils::getInputValue<2,6>
              (&local_4c,(MatrixCaseUtils *)evalCtx,
               (ShaderEvalContext *)CONCAT44(in_register_00000014,in1Type),in_ECX);
  }
  else {
    tcu::Matrix<float,_3,_2>::Matrix(&local_4c,(float *)sr::(anonymous_namespace)::s_constInMat2x3);
  }
  tcu::Matrix<float,_3,_2>::Matrix(&local_64);
  for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
    fVar1 = local_4c.m_data.m_data[1].m_data[lVar2];
    local_64.m_data.m_data[0].m_data[lVar2] = -local_4c.m_data.m_data[0].m_data[lVar2];
    local_64.m_data.m_data[1].m_data[lVar2] = -fVar1;
  }
  reduceToVec3(local_34,&local_64);
  local_28.m_vector = &evalCtx->color;
  local_28.m_index[0] = 0;
  local_28.m_index[1] = 1;
  local_28.m_index[2] = 2;
  tcu::VecAccess<float,_4,_3>::operator=(&local_28,(Vector<float,_3> *)local_34);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		DE_UNREF(in1Type);
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		evalCtx.color.xyz() = reduceToVec3(negate(in0));
	}